

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::AddTestPattern
          (ParameterizedTestSuiteInfo<BloatyOutputTest> *this,char *test_suite_name,
          char *test_base_name,TestMetaFactoryBase<BloatyTestEntry> *meta_factory,
          CodeLocation *code_location)

{
  pointer pcVar1;
  TestInfo *this_00;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo> local_68;
  CodeLocation local_58;
  
  this_00 = (TestInfo *)operator_new(0x70);
  local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
  pcVar1 = (code_location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (code_location->file)._M_string_length);
  local_58.line = code_location->line;
  TestInfo::TestInfo(this_00,test_suite_name,test_base_name,meta_factory,&local_58);
  local_68.
  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo*>
            (&local_68.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>>>
  ::
  emplace_back<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>>
            ((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>>>
              *)&this->tests_,&local_68);
  if (local_68.
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != &local_58.file.field_2) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }